

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowTabBar::mouseReleaseEvent(QMainWindowTabBar *this,QMouseEvent *e)

{
  bool bVar1;
  MouseButton MVar2;
  QObjectPrivate *pQVar3;
  QSinglePointEvent *in_RSI;
  QPointer<QDockWidget> *in_RDI;
  QDockWidgetPrivate *dockPriv;
  EndDragMode in_stack_0000002c;
  QDockWidgetPrivate *in_stack_00000030;
  QDockWidget *in_stack_ffffffffffffffd8;
  
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QDockWidget> *)0x5f7e75);
  if ((bVar1) && (MVar2 = QSinglePointEvent::button(in_RSI), MVar2 == LeftButton)) {
    ::QPointer::operator_cast_to_QDockWidget_((QPointer<QDockWidget> *)0x5f7e98);
    pQVar3 = QObjectPrivate::get((QObject *)0x5f7ea0);
    if ((*(long *)(pQVar3 + 600) != 0) && ((*(byte *)(*(long *)(pQVar3 + 600) + 0x18) & 1) != 0)) {
      QDockWidgetPrivate::endDrag(in_stack_00000030,in_stack_0000002c);
    }
    QPointer<QDockWidget>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  }
  QTabBar::mouseReleaseEvent(&this->super_QTabBar,e);
  return;
}

Assistant:

void QMainWindowTabBar::mouseReleaseEvent(QMouseEvent *e)
{
    if (draggingDock && e->button() == Qt::LeftButton) {
        QDockWidgetPrivate *dockPriv = static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(draggingDock));
        if (dockPriv->state && dockPriv->state->dragging)
            dockPriv->endDrag(QDockWidgetPrivate::EndDragMode::LocationChange);

        draggingDock = nullptr;
    }
    QTabBar::mouseReleaseEvent(e);
}